

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O3

char * serilizeRr(DNSRr *dnsRr,int *length)

{
  ushort uVar1;
  void *pvVar2;
  ushort uVar3;
  ushort uVar4;
  in_addr_t iVar5;
  uint uVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  void *pvVar11;
  DNSQuery *__src;
  DNSRr *pDVar12;
  void *pvVar13;
  ushort uVar14;
  int iVar15;
  int *piVar16;
  int *piVar17;
  int *piVar18;
  char *pcVar19;
  char *name;
  ushort *puVar20;
  long lVar21;
  ushort *dnsQuery;
  size_t sVar22;
  int iStack_10c;
  ushort uStack_108;
  ushort uStack_106;
  ushort uStack_104;
  ushort uStack_102;
  void *pvStack_100;
  void *pvStack_f8;
  uint uStack_ec;
  int *piStack_e8;
  char *pcStack_e0;
  char *pcStack_d8;
  char *pcStack_d0;
  size_t sStack_c8;
  code *pcStack_c0;
  int *piStack_b0;
  char *pcStack_a8;
  DNSRr *pDStack_a0;
  char *pcStack_98;
  size_t sStack_90;
  code *pcStack_88;
  size_t sStack_78;
  char *local_40;
  
  piVar16 = length;
  pcVar7 = toInternetFormat(dnsRr->name);
  if (dnsRr->type == 1) {
    sVar22 = 4;
  }
  else {
    local_40 = toInternetFormat(dnsRr->data);
    sVar22 = strlen(local_40);
  }
  sVar8 = strlen(pcVar7);
  iVar15 = (int)sVar22;
  pcVar19 = (char *)((long)iVar15 + sVar8 + 0xe);
  pcVar9 = (char *)malloc((size_t)pcVar19);
  if (pcVar9 != (char *)0x0) {
    strcpy(pcVar9,pcVar7);
    pcVar19 = pcVar9 + sVar8;
    free(pcVar7);
    uVar3 = dnsRr->type;
    *(ushort *)(pcVar9 + sVar8 + 1) = uVar3 << 8 | uVar3 >> 8;
    *(unsigned_short *)(pcVar9 + sVar8 + 3) = dnsRr->class << 8 | dnsRr->class >> 8;
    uVar6 = dnsRr->ttl;
    *(uint *)(pcVar9 + sVar8 + 5) =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    uVar1 = (ushort)sVar22;
    if (uVar3 == 1) {
      *(ushort *)(pcVar19 + 9) = uVar1 << 8 | uVar1 >> 8;
      iVar5 = inet_addr(dnsRr->data);
      *(in_addr_t *)(pcVar19 + 0xb) = iVar5;
      lVar21 = 0xb;
    }
    else {
      if (uVar3 == 0xf) {
        *(ushort *)(pcVar19 + 9) = (uVar1 + 3) * 0x100 | (ushort)(uVar1 + 3) >> 8;
        pcVar19[0xb] = '\0';
        pcVar19[0xc] = '\x05';
        lVar21 = 0xd;
      }
      else {
        *(ushort *)(pcVar19 + 9) = (uVar1 + 1) * 0x100 | (ushort)(uVar1 + 1) >> 8;
        lVar21 = 0xb;
      }
      memcpy(pcVar19 + lVar21,local_40,(long)(iVar15 + 1));
      free(local_40);
    }
    *length = (iVar15 + 1 + (int)lVar21 + (int)pcVar19) - (int)pcVar9;
    return pcVar9;
  }
  serilizeRr_cold_1();
  pcStack_88 = (code *)0x1023ea;
  piVar17 = piVar16;
  sStack_78 = sVar8;
  pcVar9 = toLocalFormat(pcVar19);
  name = (char *)0x104;
  pcStack_88 = (code *)0x1023f7;
  pcVar10 = (char *)malloc(0x104);
  if (pcVar10 != (char *)0x0) {
    pcStack_88 = (code *)0x10240a;
    strcpy(pcVar10,pcVar9);
    pcStack_88 = (code *)0x102412;
    sVar22 = strlen(pcVar19);
    pcStack_88 = (code *)0x102421;
    free(pcVar9);
    *(ushort *)(pcVar10 + 0x100) =
         *(ushort *)(pcVar19 + sVar22 + 1) << 8 | *(ushort *)(pcVar19 + sVar22 + 1) >> 8;
    *(ushort *)(pcVar10 + 0x102) =
         *(ushort *)(pcVar19 + sVar22 + 3) << 8 | *(ushort *)(pcVar19 + sVar22 + 3) >> 8;
    *piVar16 = (int)sVar22 + 5;
    return pcVar10;
  }
  pcStack_88 = deserilizeRr;
  deserilizeQuery_cold_1();
  pcStack_c0 = (code *)0x10247a;
  piVar18 = piVar17;
  piStack_b0 = piVar16;
  pcStack_a8 = pcVar9;
  pDStack_a0 = dnsRr;
  pcStack_98 = pcVar19;
  sStack_90 = sVar22;
  pcStack_88 = (code *)pcVar7;
  pcVar19 = toLocalFormat(name);
  puVar20 = (ushort *)0x20e;
  pcStack_c0 = (code *)0x102487;
  pcVar10 = (char *)malloc(0x20e);
  if (pcVar10 == (char *)0x0) {
    pcStack_c0 = deserializeDNS;
    deserilizeRr_cold_1();
    if (((int *)0xb < piVar18) && (uStack_ec = (uint)puVar20[1], (puVar20[1] & 0x7078) == 0)) {
      uStack_102 = puVar20[4];
      dnsQuery = puVar20 + 6;
      pvStack_f8 = (void *)CONCAT62(pvStack_f8._2_6_,puVar20[5]);
      uVar3 = puVar20[3];
      uVar1 = *puVar20;
      uVar4 = puVar20[2];
      uVar14 = uVar4 << 8 | uVar4 >> 8;
      uStack_104 = uVar14;
      piStack_e8 = piVar17;
      pcStack_e0 = pcVar9;
      pcStack_d8 = pcVar19;
      pcStack_d0 = name;
      sStack_c8 = sVar22;
      pcStack_c0 = (code *)pcVar7;
      if (uVar4 == 0) {
        pvVar11 = (void *)0x0;
      }
      else {
        pvStack_100 = (void *)CONCAT62(pvStack_100._2_6_,uVar3);
        pvVar11 = malloc((ulong)uVar14 * 0x100 + (ulong)uVar14 * 4);
        uVar6 = 1;
        if (1 < uVar14) {
          uVar6 = (uint)uVar14;
        }
        lVar21 = 0;
        do {
          __src = deserilizeQuery((char *)dnsQuery,&iStack_10c);
          memcpy((void *)((long)pvVar11 + lVar21),__src,0x104);
          dnsQuery = (ushort *)((long)iStack_10c + (long)dnsQuery);
          free(__src);
          lVar21 = lVar21 + 0x104;
        } while ((ulong)(uVar6 << 8) + (ulong)uVar6 * 4 != lVar21);
        uVar3 = (ushort)pvStack_100;
      }
      uVar4 = uVar3 << 8 | uVar3 >> 8;
      uStack_106 = uVar4;
      pvStack_100 = pvVar11;
      if (uVar3 == 0) {
        pvVar11 = (void *)0x0;
      }
      else {
        pvVar11 = malloc((ulong)uVar4 * 0x20c);
        uVar3 = 1;
        if (1 < uVar4) {
          uVar3 = uVar4;
        }
        lVar21 = 0;
        do {
          pDVar12 = deserilizeRr((char *)dnsQuery,&iStack_10c);
          memcpy((void *)((long)pvVar11 + lVar21),pDVar12,0x20c);
          dnsQuery = (ushort *)((long)iStack_10c + (long)dnsQuery);
          free(pDVar12);
          lVar21 = lVar21 + 0x20c;
        } while ((ulong)uVar3 * 0x20c - lVar21 != 0);
      }
      uVar3 = (ushort)pvStack_f8 << 8 | (ushort)pvStack_f8 >> 8;
      if ((ushort)pvStack_f8 == 0) {
        pvVar13 = (void *)0x0;
      }
      else {
        uStack_108 = uVar3;
        pvStack_f8 = pvVar11;
        pvVar13 = malloc((ulong)uVar3 * 0x20c);
        uVar4 = 1;
        if (1 < uVar3) {
          uVar4 = uVar3;
        }
        lVar21 = 0;
        do {
          pDVar12 = deserilizeRr((char *)dnsQuery,&iStack_10c);
          memcpy((void *)((long)pvVar13 + lVar21),pDVar12,0x20c);
          dnsQuery = (ushort *)((long)dnsQuery + (long)iStack_10c);
          free(pDVar12);
          lVar21 = lVar21 + 0x20c;
          pvVar11 = pvStack_f8;
          uVar3 = uStack_108;
        } while ((ulong)uVar4 * 0x20c - lVar21 != 0);
      }
      pvVar2 = pvStack_100;
      puVar20 = (ushort *)malloc(0x30);
      *puVar20 = uVar1 << 8 | uVar1 >> 8;
      puVar20[1] = (ushort)uStack_ec;
      puVar20[2] = uStack_104;
      puVar20[3] = uStack_106;
      puVar20[4] = uStack_102;
      puVar20[5] = uVar3;
      puVar20[6] = 0;
      puVar20[7] = 0;
      *(void **)(puVar20 + 8) = pvVar2;
      *(void **)(puVar20 + 0xc) = pvVar11;
      puVar20[0x10] = 0;
      puVar20[0x11] = 0;
      puVar20[0x12] = 0;
      puVar20[0x13] = 0;
      *(void **)(puVar20 + 0x14) = pvVar13;
      return (char *)puVar20;
    }
    return (char *)0x0;
  }
  pcStack_c0 = (code *)0x10249e;
  strcpy(pcVar10,pcVar19);
  pcStack_c0 = (code *)0x1024a6;
  sVar22 = strlen(name);
  pcVar7 = name + sVar22;
  pcStack_c0 = (code *)0x1024b5;
  free(pcVar19);
  uVar3 = *(ushort *)(name + sVar22 + 1) << 8 | *(ushort *)(name + sVar22 + 1) >> 8;
  *(ushort *)(pcVar10 + 0x100) = uVar3;
  *(ushort *)(pcVar10 + 0x102) =
       *(ushort *)(name + sVar22 + 3) << 8 | *(ushort *)(name + sVar22 + 3) >> 8;
  uVar6 = *(uint *)(name + sVar22 + 5);
  *(uint *)(pcVar10 + 0x104) =
       uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  *(ushort *)(pcVar10 + 0x108) =
       *(ushort *)(name + sVar22 + 9) << 8 | *(ushort *)(name + sVar22 + 9) >> 8;
  if (uVar3 == 0xf) {
    pcStack_c0 = (code *)0x102540;
    pcVar9 = toLocalFormat(pcVar7 + 0xd);
    pcStack_c0 = (code *)0x10254b;
    strcpy(pcVar10 + 0x10a,pcVar9);
    pcStack_c0 = (code *)0x102553;
    sVar22 = strlen(pcVar7 + 0xd);
    iVar15 = (int)pcVar7 + (int)sVar22 + 0xe;
  }
  else if (uVar3 == 1) {
    pcStack_c0 = (code *)0x102519;
    pcVar9 = inet_ntoa((in_addr)*(in_addr_t *)(pcVar7 + 0xb));
    pcStack_c0 = (code *)0x102524;
    strcpy(pcVar10 + 0x10a,pcVar9);
    iVar15 = (int)pcVar7 + 0xf;
  }
  else {
    pcVar9 = name + sVar22 + 0xb;
    pcStack_c0 = (code *)0x102575;
    pcVar7 = toLocalFormat(pcVar9);
    pcStack_c0 = (code *)0x102580;
    strcpy(pcVar10 + 0x10a,pcVar7);
    pcStack_c0 = (code *)0x102588;
    sVar22 = strlen(pcVar9);
    iVar15 = (int)pcVar9 + (int)sVar22 + 1;
  }
  *piVar17 = iVar15 - (int)name;
  return pcVar10;
}

Assistant:

char *serilizeRr(DNSRr *dnsRr, int *length)
{

    char *formatedName = toInternetFormat(dnsRr->name);
    int dataLength = 0;
    char *formatedData;
    if (dnsRr->type == T_A)
    {
        dataLength = 4;
    } else
    {
        formatedData = toInternetFormat(dnsRr->data);
        dataLength = strlen(formatedData);
    }
    char *result = (char *) malloc(strlen(formatedName) + dataLength + 4 + 4 + 2 + 2 + 2);
    checkMalloc(result);

    char *ptr = result;
    strcpy(ptr, formatedName);

    ptr += strlen(formatedName) + 1;
    free(formatedName);
    *(unsigned short *) ptr = htons(dnsRr->type);
    ptr += 2;
    *(unsigned short *) ptr = htons(dnsRr->class);
    ptr += 2;
    *(unsigned int *) ptr = htonl(dnsRr->ttl);

    ptr += 4;


    if (dnsRr->type == T_MX)
    {
        *(unsigned short *) ptr = htons(dataLength + 3);
        ptr += 2;
        *(unsigned short *) ptr = htons(0x05);
        ptr += 2;
    } else if (dnsRr->type == T_A)
    {
        *(unsigned short *) ptr = htons(dataLength);
        ptr += 2;
    } else
    {
        *(unsigned short *) ptr = htons(dataLength + 1);
        ptr += 2;
    }

    if (dnsRr->type == T_A)
    {
        *(unsigned int *) ptr = inet_addr(dnsRr->data);

    } else
    {
        memcpy(ptr, formatedData, dataLength + 1);
        free(formatedData);
    }
    ptr += dataLength + 1;

    *length = ptr - result;
    return result;
}